

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
evaluateCostGradient(MultipleShootingTranscription *this,VectorDynSize *gradient)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  undefined8 uVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ostream *poVar21;
  Index index;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  Index index_1;
  ulong uVar25;
  long lVar26;
  Index alignedEnd;
  pointer paVar27;
  Index alignedEnd_1;
  ulong uVar28;
  Index alignedStart_1;
  bool bVar29;
  Index size_1;
  Index size_3;
  Index size;
  Index size_2;
  ostringstream errorMsg;
  long *local_1f8;
  long local_1e8 [2];
  ulong local_1d8;
  ulong local_1d0;
  long local_1c8;
  ulong local_1c0;
  VectorDynSize *local_1b8;
  VectorDynSize *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->m_prepared == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","evaluateCostGradient",
               "First you need to call the prepare method");
    bVar29 = false;
  }
  else {
    uVar12 = iDynTree::VectorDynSize::data();
    uVar13 = iDynTree::VectorDynSize::size();
    uVar14 = iDynTree::VectorDynSize::data();
    uVar15 = iDynTree::VectorDynSize::size();
    lVar16 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    lVar17 = iDynTree::VectorDynSize::data();
    local_1b0 = &this->m_costStateGradientBuffer;
    iDynTree::VectorDynSize::size();
    lVar18 = iDynTree::VectorDynSize::data();
    local_1b8 = &this->m_costControlGradientBuffer;
    iDynTree::VectorDynSize::size();
    local_1c0 = this->m_nx;
    uVar7 = this->m_nu;
    uVar19 = iDynTree::VectorDynSize::size();
    uVar11 = (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[4])(this);
    if (uVar19 != uVar11) {
      (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[4])(this);
      iDynTree::VectorDynSize::resize((ulong)gradient);
    }
    lVar20 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    paVar27 = (this->m_meshPoints).
              super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar29 = paVar27 == (this->m_meshPointsEnd)._M_current;
    if (!bVar29) {
      local_1d0 = (ulong)((uint)(uVar12 >> 3) & 1);
      if ((long)uVar13 <= (long)local_1d0) {
        local_1d0 = uVar13;
      }
      uVar19 = (ulong)((uint)(uVar14 >> 3) & 1);
      if ((long)uVar15 <= (long)uVar19) {
        uVar19 = uVar15;
      }
      if ((uVar12 & 7) != 0) {
        local_1d0 = uVar13;
      }
      lVar22 = uVar13 - local_1d0;
      local_1d8 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + local_1d0;
      if ((uVar14 & 7) != 0) {
        uVar19 = uVar15;
      }
      local_1c8 = uVar15 - uVar19;
      uVar28 = (local_1c8 - (local_1c8 >> 0x3f) & 0xfffffffffffffffeU) + uVar19;
      do {
        lVar26 = lVar16 + paVar27->stateIndex * 8;
        if (0 < (long)local_1d0) {
          uVar23 = 0;
          do {
            *(undefined8 *)(uVar12 + uVar23 * 8) = *(undefined8 *)(lVar26 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (local_1d0 != uVar23);
        }
        uVar23 = local_1d0;
        if (1 < lVar22) {
          do {
            puVar1 = (undefined8 *)(lVar26 + uVar23 * 8);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)(uVar12 + uVar23 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            uVar23 = uVar23 + 2;
          } while ((long)uVar23 < (long)local_1d8);
        }
        uVar23 = local_1d8;
        if ((long)local_1d8 < (long)uVar13) {
          do {
            *(undefined8 *)(uVar12 + uVar23 * 8) = *(undefined8 *)(lVar26 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (uVar13 != uVar23);
        }
        lVar26 = lVar16 + paVar27->controlIndex * 8;
        if (0 < (long)uVar19) {
          uVar23 = 0;
          do {
            *(undefined8 *)(uVar14 + uVar23 * 8) = *(undefined8 *)(lVar26 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (uVar19 != uVar23);
        }
        uVar23 = uVar19;
        if (1 < local_1c8) {
          do {
            puVar1 = (undefined8 *)(lVar26 + uVar23 * 8);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)(uVar14 + uVar23 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            uVar23 = uVar23 + 2;
          } while ((long)uVar23 < (long)uVar28);
        }
        uVar23 = uVar28;
        if ((long)uVar28 < (long)uVar15) {
          do {
            *(undefined8 *)(uVar14 + uVar23 * 8) = *(undefined8 *)(lVar26 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (uVar15 != uVar23);
        }
        bVar10 = OptimalControlProblem::costsFirstPartialDerivativeWRTState
                           ((this->m_ocproblem).
                            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,paVar27->time,&this->m_stateBuffer,&this->m_controlBuffer,
                            local_1b0);
        if (!bVar10) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost state gradient at time t = ",
                     0x37);
          poVar21 = std::ostream::_M_insert<double>(paVar27->time);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("MultipleShootingTranscription","evaluateCostGradient",(char *)local_1f8);
LAB_0015519b:
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          return bVar29;
        }
        uVar23 = lVar20 + paVar27->stateIndex * 8;
        uVar24 = local_1c0;
        if (((uVar23 & 7) == 0) &&
           (uVar24 = (ulong)((uint)(uVar23 >> 3) & 1), (long)local_1c0 <= (long)uVar24)) {
          uVar24 = local_1c0;
        }
        if (0 < (long)uVar24) {
          uVar25 = 0;
          do {
            *(undefined8 *)(uVar23 + uVar25 * 8) = *(undefined8 *)(lVar17 + uVar25 * 8);
            uVar25 = uVar25 + 1;
          } while (uVar24 != uVar25);
        }
        lVar26 = local_1c0 - uVar24;
        uVar25 = (lVar26 - (lVar26 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
        if (1 < lVar26) {
          do {
            puVar2 = (undefined8 *)(lVar17 + uVar24 * 8);
            uVar9 = puVar2[1];
            puVar1 = (undefined8 *)(uVar23 + uVar24 * 8);
            *puVar1 = *puVar2;
            puVar1[1] = uVar9;
            uVar24 = uVar24 + 2;
          } while ((long)uVar24 < (long)uVar25);
        }
        if ((long)uVar25 < (long)local_1c0) {
          do {
            *(undefined8 *)(uVar23 + uVar25 * 8) = *(undefined8 *)(lVar17 + uVar25 * 8);
            uVar25 = uVar25 + 1;
          } while (local_1c0 != uVar25);
        }
        bVar10 = OptimalControlProblem::costsFirstPartialDerivativeWRTControl
                           ((this->m_ocproblem).
                            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,paVar27->time,&this->m_stateBuffer,&this->m_controlBuffer,
                            local_1b8);
        if (!bVar10) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Error while evaluating cost control gradient at time t = ",0x39);
          poVar21 = std::ostream::_M_insert<double>(paVar27->time);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("MultipleShootingTranscription","evaluateCostGradient",(char *)local_1f8);
          goto LAB_0015519b;
        }
        if (paVar27->type == State) {
          uVar23 = lVar20 + paVar27->controlIndex * 8;
          uVar24 = uVar7;
          if (((uVar23 & 7) == 0) &&
             (uVar24 = (ulong)((uint)(uVar23 >> 3) & 1), (long)uVar7 <= (long)uVar24)) {
            uVar24 = uVar7;
          }
          if (0 < (long)uVar24) {
            uVar25 = 0;
            do {
              *(double *)(uVar23 + uVar25 * 8) =
                   *(double *)(lVar18 + uVar25 * 8) + *(double *)(uVar23 + uVar25 * 8);
              uVar25 = uVar25 + 1;
            } while (uVar24 != uVar25);
          }
          lVar26 = uVar7 - uVar24;
          uVar25 = (lVar26 - (lVar26 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
          if (1 < lVar26) {
            do {
              pdVar3 = (double *)(lVar18 + uVar24 * 8);
              dVar8 = pdVar3[1];
              pdVar4 = (double *)(uVar23 + uVar24 * 8);
              dVar6 = pdVar4[1];
              pdVar5 = (double *)(uVar23 + uVar24 * 8);
              *pdVar5 = *pdVar3 + *pdVar4;
              pdVar5[1] = dVar8 + dVar6;
              uVar24 = uVar24 + 2;
            } while ((long)uVar24 < (long)uVar25);
          }
          if ((long)uVar25 < (long)uVar7) {
            do {
              *(double *)(uVar23 + uVar25 * 8) =
                   *(double *)(lVar18 + uVar25 * 8) + *(double *)(uVar23 + uVar25 * 8);
              uVar25 = uVar25 + 1;
            } while (uVar7 != uVar25);
          }
        }
        else if (paVar27->type == Control) {
          uVar23 = lVar20 + paVar27->controlIndex * 8;
          uVar24 = uVar7;
          if (((uVar23 & 7) == 0) &&
             (uVar24 = (ulong)((uint)(uVar23 >> 3) & 1), (long)uVar7 <= (long)uVar24)) {
            uVar24 = uVar7;
          }
          if (0 < (long)uVar24) {
            uVar25 = 0;
            do {
              *(undefined8 *)(uVar23 + uVar25 * 8) = *(undefined8 *)(lVar18 + uVar25 * 8);
              uVar25 = uVar25 + 1;
            } while (uVar24 != uVar25);
          }
          lVar26 = uVar7 - uVar24;
          uVar25 = (lVar26 - (lVar26 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
          if (1 < lVar26) {
            do {
              puVar1 = (undefined8 *)(lVar18 + uVar24 * 8);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)(uVar23 + uVar24 * 8);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              uVar24 = uVar24 + 2;
            } while ((long)uVar24 < (long)uVar25);
          }
          if ((long)uVar25 < (long)uVar7) {
            do {
              *(undefined8 *)(uVar23 + uVar25 * 8) = *(undefined8 *)(lVar18 + uVar25 * 8);
              uVar25 = uVar25 + 1;
            } while (uVar7 != uVar25);
          }
        }
        paVar27 = paVar27 + 1;
        bVar29 = paVar27 == (this->m_meshPointsEnd)._M_current;
      } while (!bVar29);
    }
  }
  return bVar29;
}

Assistant:

virtual bool evaluateCostGradient(VectorDynSize& gradient) override {

                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "evaluateCostGradient", "First you need to call the prepare method");
                    return false;
                }

                Eigen::Map<Eigen::VectorXd> stateBufferMap = toEigen(m_stateBuffer);
                Eigen::Map<Eigen::VectorXd> controlBufferMap = toEigen(m_controlBuffer);
                Eigen::Map<Eigen::VectorXd> variablesBuffer = toEigen(m_variablesBuffer);
                Eigen::Map<Eigen::VectorXd> costStateGradient = toEigen(m_costStateGradientBuffer);
                Eigen::Map<Eigen::VectorXd> costControlGradient = toEigen(m_costControlGradientBuffer);

                Eigen::Index nx = static_cast<Eigen::Index>(m_nx);
                Eigen::Index nu = static_cast<Eigen::Index>(m_nu);

                if (gradient.size() != numberOfVariables()) {
                    gradient.resize(static_cast<unsigned int>(numberOfVariables()));
                }

                Eigen::Map<Eigen::VectorXd> gradientMap = toEigen(gradient);

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){

                    stateBufferMap = variablesBuffer.segment(static_cast<Eigen::Index>(mesh->stateIndex), nx);
                    controlBufferMap = variablesBuffer.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu);

                    if (!(m_ocproblem->costsFirstPartialDerivativeWRTState(mesh->time, m_stateBuffer, m_controlBuffer, m_costStateGradientBuffer))){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost state gradient at time t = " << mesh->time << ".";
                        reportError("MultipleShootingTranscription", "evaluateCostGradient", errorMsg.str().c_str());
                        return false;
                    }

                    gradientMap.segment(static_cast<Eigen::Index>(mesh->stateIndex), nx) = costStateGradient;


                    if (!(m_ocproblem->costsFirstPartialDerivativeWRTControl(mesh->time, m_stateBuffer, m_controlBuffer, m_costControlGradientBuffer))){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost control gradient at time t = " << mesh->time << ".";
                        reportError("MultipleShootingTranscription", "evaluateCostGradient", errorMsg.str().c_str());
                        return false;
                    }

                    if (mesh->type == MeshPointType::Control){
                        gradientMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu) = costControlGradient;
                    } else if (mesh->type == MeshPointType::State) {
                        gradientMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu) += costControlGradient;
                    }

                }

                return true;
            }